

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O0

int __thiscall
QFileDialog::accept(QFileDialog *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  bool bVar1;
  FileMode FVar2;
  AcceptMode AVar3;
  QFileDialogPrivate *files_00;
  qsizetype qVar4;
  QUrl *pQVar5;
  uint *puVar6;
  QString *pQVar7;
  ulong uVar8;
  uint *__addr_len_00;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *__addr_00;
  sockaddr *__addr_01;
  sockaddr *__addr_02;
  sockaddr *__addr_03;
  sockaddr *__addr_04;
  int iVar9;
  long in_FS_OFFSET;
  QString *file;
  QStringList *__range2;
  long maxNameLength;
  FileMode mode;
  QFileDialogPrivate *d;
  QFileInfo info_2;
  const_iterator __end2;
  const_iterator __begin2;
  QFileInfo info_1;
  QString fn_1;
  QFileInfo info;
  QString fn;
  QString lineEditText;
  QStringList files;
  QList<QUrl> urls;
  QSignalBlocker blocker;
  undefined4 in_stack_fffffffffffffd78;
  Option in_stack_fffffffffffffd7c;
  QFileDialogPrivate *in_stack_fffffffffffffd80;
  QFileDialogPrivate *in_stack_fffffffffffffd88;
  QFileDialogPrivate *in_stack_fffffffffffffd90;
  QFileDialogPrivate *this_00;
  undefined4 in_stack_fffffffffffffda8;
  FileMode in_stack_fffffffffffffdac;
  uint uVar10;
  QFileDialog *in_stack_fffffffffffffdb0;
  undefined7 in_stack_fffffffffffffdb8;
  undefined1 in_stack_fffffffffffffdbf;
  QFileDialog *in_stack_fffffffffffffdc0;
  QFileDialogPrivate *in_stack_fffffffffffffdd0;
  undefined1 local_1b8 [24];
  QFileInfo local_1a0 [8];
  undefined1 *local_198;
  QString *local_190;
  const_iterator local_188;
  const_iterator local_180;
  undefined1 local_178 [48];
  undefined1 local_148 [24];
  QString local_130 [3];
  undefined1 *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  undefined1 local_b0 [24];
  QFileInfo local_98 [8];
  undefined1 *local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  QLatin1StringView local_70;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  QList<QUrl> local_30;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  files_00 = d_func((QFileDialog *)0x75bdd6);
  bVar1 = QFileDialogPrivate::usingWidgets(in_stack_fffffffffffffd80);
  if (!bVar1) {
    local_30.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_30.d.ptr = (QUrl *)&DAT_aaaaaaaaaaaaaaaa;
    local_30.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    selectedUrls((QFileDialog *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    bVar1 = QList<QUrl>::isEmpty((QList<QUrl> *)0x75be3f);
    if (!bVar1) {
      iVar9 = (int)&local_30;
      QFileDialogPrivate::emitUrlsSelected
                (in_stack_fffffffffffffd90,(QList<QUrl> *)in_stack_fffffffffffffd88);
      qVar4 = QList<QUrl>::size(&local_30);
      __addr_00 = extraout_RDX;
      if (qVar4 == 1) {
        pQVar5 = QList<QUrl>::first((QList<QUrl> *)in_stack_fffffffffffffd80);
        iVar9 = (int)pQVar5;
        QFileDialogPrivate::emitUrlSelected
                  (in_stack_fffffffffffffd90,(QUrl *)in_stack_fffffffffffffd88);
        __addr_00 = extraout_RDX_00;
      }
      QDialog::accept(&this->super_QDialog,iVar9,__addr_00,__addr_len);
    }
    QList<QUrl>::~QList((QList<QUrl> *)0x75bec3);
    goto LAB_0075c79c;
  }
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  selectedFiles(in_stack_fffffffffffffdc0);
  bVar1 = QList<QString>::isEmpty((QList<QString> *)0x75bf14);
  if (!bVar1) {
    local_60 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    local_50 = &DAT_aaaaaaaaaaaaaaaa;
    QFileDialogPrivate::lineEdit((QFileDialogPrivate *)0x75bf64);
    QLineEdit::text((QLineEdit *)in_stack_fffffffffffffd88);
    local_70 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)in_stack_fffffffffffffd88,(size_t)in_stack_fffffffffffffd80);
    bVar1 = ::operator==((QString *)in_stack_fffffffffffffd88,
                         (QLatin1StringView *)in_stack_fffffffffffffd80);
    if (bVar1) {
      QFileDialogPrivate::navigateToParent(in_stack_fffffffffffffd88);
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
                (&files_00->qFileDialogUi);
      QSignalBlocker::QSignalBlocker
                ((QSignalBlocker *)in_stack_fffffffffffffd90,(QObject *)in_stack_fffffffffffffd88);
      QFileDialogPrivate::lineEdit((QFileDialogPrivate *)0x75c013);
      QLineEdit::selectAll((QLineEdit *)in_stack_fffffffffffffd80);
      QSignalBlocker::~QSignalBlocker((QSignalBlocker *)in_stack_fffffffffffffd80);
    }
    else {
      FVar2 = fileMode((QFileDialog *)in_stack_fffffffffffffd80);
      pQVar7 = (QString *)(ulong)FVar2;
      __addr_len_00 = &switchD_0075c072::switchdataD_00b2d260;
      switch(pQVar7) {
      case (QString *)0x0:
        local_e0 = &DAT_aaaaaaaaaaaaaaaa;
        local_d8 = &DAT_aaaaaaaaaaaaaaaa;
        local_d0 = &DAT_aaaaaaaaaaaaaaaa;
        QList<QString>::first((QList<QString> *)in_stack_fffffffffffffd80);
        QString::QString((QString *)in_stack_fffffffffffffd80,
                         (QString *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
        local_e8 = &DAT_aaaaaaaaaaaaaaaa;
        QFileInfo::QFileInfo((QFileInfo *)&local_e8,(QString *)&local_e0);
        uVar8 = QFileInfo::isDir();
        if ((uVar8 & 1) == 0) {
          uVar8 = QFileInfo::exists();
          if ((uVar8 & 1) == 0) {
            QFileInfo::path();
            puVar6 = (uint *)QFileDialogPrivate::maxNameLength((QString *)in_stack_fffffffffffffd80)
            ;
            QString::~QString((QString *)0x75c325);
            bVar1 = false;
            __addr_len_00 = puVar6;
            if (-1 < (long)puVar6) {
              QFileInfo::fileName();
              qVar4 = QString::size(local_130);
              bVar1 = (long)puVar6 < qVar4;
            }
            uVar10 = (uint)bVar1 << 0x18;
            if (-1 < (long)puVar6) {
              QString::~QString((QString *)0x75c39f);
            }
            if ((uVar10 & 0x1000000) != 0) goto LAB_0075c4e7;
          }
          uVar8 = QFileInfo::exists();
          if ((((uVar8 & 1) == 0) ||
              (bVar1 = testOption((QFileDialog *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c
                                 ), bVar1)) ||
             (AVar3 = acceptMode((QFileDialog *)in_stack_fffffffffffffd80), AVar3 == AcceptOpen)) {
            QList<QString>::QList<QString,void>
                      ((QList<QString> *)in_stack_fffffffffffffd80,
                       (QString *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
            iVar9 = (int)local_148;
            QFileDialogPrivate::emitFilesSelected
                      (in_stack_fffffffffffffd90,(QStringList *)in_stack_fffffffffffffd88);
            QList<QString>::~QList((QList<QString> *)0x75c431);
            QDialog::accept(&this->super_QDialog,iVar9,__addr_02,__addr_len_00);
          }
          else {
            this_00 = files_00;
            QFileInfo::fileName();
            bVar1 = QFileDialogPrivate::itemAlreadyExists(in_stack_fffffffffffffdd0,pQVar7);
            QString::~QString((QString *)0x75c485);
            if (bVar1) {
              QList<QString>::QList<QString,void>
                        ((QList<QString> *)in_stack_fffffffffffffd80,
                         (QString *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
              iVar9 = (int)local_178;
              QFileDialogPrivate::emitFilesSelected(this_00,(QStringList *)files_00);
              QList<QString>::~QList((QList<QString> *)0x75c4d0);
              QDialog::accept(&this->super_QDialog,iVar9,__addr_03,__addr_len_00);
            }
          }
        }
        else {
          QFileInfo::absoluteFilePath();
          setDirectory(in_stack_fffffffffffffdb0,
                       (QString *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
          QString::~QString((QString *)0x75c2cc);
        }
LAB_0075c4e7:
        QFileInfo::~QFileInfo((QFileInfo *)&local_e8);
        QString::~QString((QString *)0x75c501);
        break;
      case (QString *)0x1:
      case (QString *)0x3:
        local_180.i = (QString *)&DAT_aaaaaaaaaaaaaaaa;
        local_180 = QList<QString>::begin((QList<QString> *)in_stack_fffffffffffffd80);
        local_188.i = (QString *)&DAT_aaaaaaaaaaaaaaaa;
        local_188 = QList<QString>::end((QList<QString> *)in_stack_fffffffffffffd80);
        while( true ) {
          local_190 = local_188.i;
          bVar1 = QList<QString>::const_iterator::operator!=(&local_180,local_188);
          if (!bVar1) break;
          pQVar7 = QList<QString>::const_iterator::operator*(&local_180);
          local_198 = &DAT_aaaaaaaaaaaaaaaa;
          QFileInfo::QFileInfo((QFileInfo *)&local_198,(QString *)pQVar7);
          uVar8 = QFileInfo::exists();
          if ((uVar8 & 1) == 0) {
            QFileDialogPrivate::getEnvironmentVariable
                      (in_stack_fffffffffffffd90,(QString *)in_stack_fffffffffffffd88);
            QFileInfo::QFileInfo(local_1a0,(QString *)local_1b8);
            QFileInfo::operator=
                      ((QFileInfo *)in_stack_fffffffffffffd80,
                       (QFileInfo *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
            QFileInfo::~QFileInfo(local_1a0);
            QString::~QString((QString *)0x75c643);
          }
          uVar8 = QFileInfo::exists();
          if ((uVar8 & 1) == 0) {
            in_stack_fffffffffffffd80 = files_00;
            QFileInfo::fileName();
            QFileDialogPrivate::itemNotFound
                      ((QFileDialogPrivate *)
                       CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8),
                       (QString *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac);
            QString::~QString((QString *)0x75c69c);
            bVar1 = true;
          }
          else {
            uVar8 = QFileInfo::isDir();
            if ((uVar8 & 1) == 0) {
              bVar1 = false;
            }
            else {
              QFileInfo::absoluteFilePath();
              setDirectory(in_stack_fffffffffffffdb0,
                           (QString *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8))
              ;
              QString::~QString((QString *)0x75c6f0);
              QFileDialogPrivate::lineEdit((QFileDialogPrivate *)0x75c6fd);
              QLineEdit::clear((QLineEdit *)in_stack_fffffffffffffd80);
              bVar1 = true;
            }
          }
          QFileInfo::~QFileInfo((QFileInfo *)&local_198);
          if (bVar1) goto switchD_0075c072_default;
          QList<QString>::const_iterator::operator++(&local_180);
        }
        iVar9 = (int)&local_48;
        QFileDialogPrivate::emitFilesSelected
                  (in_stack_fffffffffffffd90,(QStringList *)in_stack_fffffffffffffd88);
        QDialog::accept(&this->super_QDialog,iVar9,__addr_04,__addr_len_00);
        break;
      case (QString *)0x2:
        local_88 = &DAT_aaaaaaaaaaaaaaaa;
        local_80 = &DAT_aaaaaaaaaaaaaaaa;
        local_78 = &DAT_aaaaaaaaaaaaaaaa;
        QList<QString>::first((QList<QString> *)in_stack_fffffffffffffd80);
        QString::QString((QString *)in_stack_fffffffffffffd80,
                         (QString *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
        local_90 = &DAT_aaaaaaaaaaaaaaaa;
        QFileInfo::QFileInfo((QFileInfo *)&local_90,(QString *)&local_88);
        uVar8 = QFileInfo::exists();
        if ((uVar8 & 1) == 0) {
          QFileDialogPrivate::getEnvironmentVariable
                    (in_stack_fffffffffffffd90,(QString *)in_stack_fffffffffffffd88);
          QFileInfo::QFileInfo(local_98,(QString *)local_b0);
          QFileInfo::operator=
                    ((QFileInfo *)in_stack_fffffffffffffd80,
                     (QFileInfo *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
          QFileInfo::~QFileInfo(local_98);
          QString::~QString((QString *)0x75c155);
        }
        uVar8 = QFileInfo::exists();
        if ((uVar8 & 1) == 0) {
          QFileInfo::fileName();
          QFileDialogPrivate::itemNotFound
                    ((QFileDialogPrivate *)
                     CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8),
                     (QString *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac);
          QString::~QString((QString *)0x75c1ae);
        }
        else {
          uVar8 = QFileInfo::isDir();
          if ((uVar8 & 1) != 0) {
            iVar9 = (int)&local_48;
            QFileDialogPrivate::emitFilesSelected
                      (in_stack_fffffffffffffd90,(QStringList *)in_stack_fffffffffffffd88);
            QDialog::accept(&this->super_QDialog,iVar9,__addr_01,__addr_len_00);
          }
        }
        QFileInfo::~QFileInfo((QFileInfo *)&local_90);
        QString::~QString((QString *)0x75c212);
      }
    }
switchD_0075c072_default:
    QString::~QString((QString *)0x75c78f);
  }
  QList<QString>::~QList((QList<QString> *)0x75c79c);
LAB_0075c79c:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (int)*(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void QFileDialog::accept()
{
    Q_D(QFileDialog);
    if (!d->usingWidgets()) {
        const QList<QUrl> urls = selectedUrls();
        if (urls.isEmpty())
            return;
        d->emitUrlsSelected(urls);
        if (urls.size() == 1)
            d->emitUrlSelected(urls.first());
        QDialog::accept();
        return;
    }

    const QStringList files = selectedFiles();
    if (files.isEmpty())
        return;
    QString lineEditText = d->lineEdit()->text();
    // "hidden feature" type .. and then enter, and it will move up a dir
    // special case for ".."
    if (lineEditText == ".."_L1) {
        d->navigateToParent();
        const QSignalBlocker blocker(d->qFileDialogUi->fileNameEdit);
        d->lineEdit()->selectAll();
        return;
    }

    const auto mode = fileMode();
    switch (mode) {
    case Directory: {
        QString fn = files.first();
        QFileInfo info(fn);
        if (!info.exists())
            info = QFileInfo(d->getEnvironmentVariable(fn));
        if (!info.exists()) {
            d->itemNotFound(info.fileName(), mode);
            return;
        }
        if (info.isDir()) {
            d->emitFilesSelected(files);
            QDialog::accept();
        }
        return;
    }

    case AnyFile: {
        QString fn = files.first();
        QFileInfo info(fn);
        if (info.isDir()) {
            setDirectory(info.absoluteFilePath());
            return;
        }

        if (!info.exists()) {
            const long maxNameLength = d->maxNameLength(info.path());
            if (maxNameLength >= 0 && info.fileName().size() > maxNameLength)
                return;
        }

        // check if we have to ask for permission to overwrite the file
        if (!info.exists() || testOption(DontConfirmOverwrite) || acceptMode() == AcceptOpen) {
            d->emitFilesSelected(QStringList(fn));
            QDialog::accept();
        } else {
            if (d->itemAlreadyExists(info.fileName())) {
                d->emitFilesSelected(QStringList(fn));
                QDialog::accept();
            }
        }
        return;
    }

    case ExistingFile:
    case ExistingFiles:
        for (const auto &file : files) {
            QFileInfo info(file);
            if (!info.exists())
                info = QFileInfo(d->getEnvironmentVariable(file));
            if (!info.exists()) {
                d->itemNotFound(info.fileName(), mode);
                return;
            }
            if (info.isDir()) {
                setDirectory(info.absoluteFilePath());
                d->lineEdit()->clear();
                return;
            }
        }
        d->emitFilesSelected(files);
        QDialog::accept();
        return;
    }
}